

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkqueue_tests.cpp
# Opt level: O2

void __thiscall
CheckQueueTest::Correct_Queue_range
          (CheckQueueTest *this,vector<unsigned_long,_std::allocator<unsigned_long>_> range)

{
  long lVar1;
  ulong *puVar2;
  int iVar3;
  ulong *puVar4;
  undefined8 *in_RSI;
  pointer __new_size;
  iterator in_R8;
  iterator pvVar5;
  atomic<unsigned_long> *in_R9;
  iterator pvVar6;
  pointer pFVar7;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string file;
  const_string file_00;
  check_type cVar8;
  char *local_118;
  char *local_110;
  undefined1 *local_108;
  undefined1 *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  lazy_ostream local_c8;
  undefined1 *local_b8;
  char **local_b0;
  assertion_result local_a8;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  size_t i;
  vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> vChecks;
  __single_object small_queue;
  CCheckQueueControl<FakeCheckCheckCompletion> control;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::make_unique<CCheckQueue<FakeCheckCheckCompletion>,unsigned_int_const&,int_const&>
            ((uint *)&small_queue,(int *)&QUEUE_BATCH_SIZE);
  vChecks.super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vChecks.super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vChecks.super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>::reserve
            (&vChecks,9);
  puVar2 = (ulong *)in_RSI[1];
  for (puVar4 = (ulong *)*in_RSI; puVar4 != puVar2; puVar4 = puVar4 + 1) {
    pFVar7 = (pointer)*puVar4;
    LOCK();
    FakeCheckCheckCompletion::n_calls.super___atomic_base<unsigned_long>._M_i =
         (__atomic_base<unsigned_long>)0;
    UNLOCK();
    i = (size_t)pFVar7;
    CCheckQueueControl<FakeCheckCheckCompletion>::CCheckQueueControl
              (&control,(CCheckQueue<FakeCheckCheckCompletion> *)
                        small_queue._M_t.
                        super___uniq_ptr_impl<CCheckQueue<FakeCheckCheckCompletion>,_std::default_delete<CCheckQueue<FakeCheckCheckCompletion>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_CCheckQueue<FakeCheckCheckCompletion>_*,_std::default_delete<CCheckQueue<FakeCheckCheckCompletion>_>_>
                        .super__Head_base<0UL,_CCheckQueue<FakeCheckCheckCompletion>_*,_false>.
                        _M_head_impl);
    while (pFVar7 != (pointer)0x0) {
      if (vChecks.
          super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          vChecks.
          super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        vChecks.
        super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             vChecks.
             super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>
             ._M_impl.super__Vector_impl_data._M_start;
      }
      iVar3 = RandomMixin<FastRandomContext>::randrange<int>
                        (&(this->super_NoLockLoggingTestingSetup).super_TestingSetup.
                          super_ChainTestingSetup.super_BasicTestingSetup.m_rng.
                          super_RandomMixin<FastRandomContext>,10);
      __new_size = (pointer)(long)iVar3;
      if (pFVar7 < (pointer)(long)iVar3) {
        __new_size = pFVar7;
      }
      std::vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>::resize
                (&vChecks,(size_type)__new_size);
      pFVar7 = vChecks.
               super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>
               ._M_impl.super__Vector_impl_data._M_start +
               ((long)pFVar7 -
               (long)vChecks.
                     super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
      CCheckQueueControl<FakeCheckCheckCompletion>::Add(&control,&vChecks);
    }
    local_80 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/checkqueue_tests.cpp"
    ;
    local_78 = "";
    local_90 = &boost::unit_test::basic_cstring<char_const>::null;
    local_88 = &boost::unit_test::basic_cstring<char_const>::null;
    msg.m_end = (iterator)in_R9;
    msg.m_begin = in_R8;
    file.m_end = (iterator)0xb1;
    file.m_begin = (iterator)&local_80;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_90,msg);
    _cVar8 = 0x29de2a;
    local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)CCheckQueueControl<FakeCheckCheckCompletion>::Wait(&control);
    local_a8.m_message.px = (element_type *)0x0;
    local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_d8 = "control.Wait()";
    local_d0 = "";
    local_c8.m_empty = false;
    local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
    local_b8 = boost::unit_test::lazy_ostream::inst;
    local_b0 = &local_d8;
    local_e8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/checkqueue_tests.cpp"
    ;
    local_e0 = "";
    pvVar5 = (iterator)0x2;
    pvVar6 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_a8,&local_c8,2,0,WARN,_cVar8,(size_t)&local_e8,0xb1);
    boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
    local_f8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/checkqueue_tests.cpp"
    ;
    local_f0 = "";
    local_108 = &boost::unit_test::basic_cstring<char_const>::null;
    local_100 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_00.m_end = pvVar6;
    msg_00.m_begin = pvVar5;
    file_00.m_end = (iterator)0xb2;
    file_00.m_begin = (iterator)&local_f8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_108,
               msg_00);
    local_c8.m_empty = false;
    local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
    local_b8 = boost::unit_test::lazy_ostream::inst;
    local_b0 = (char **)0xc694e1;
    local_118 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/checkqueue_tests.cpp"
    ;
    local_110 = "";
    in_R8 = (iterator)0x2;
    in_R9 = &FakeCheckCheckCompletion::n_calls;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::atomic<unsigned_long>,unsigned_long>
              (&local_c8,&local_118,0xb2);
    CCheckQueueControl<FakeCheckCheckCompletion>::~CCheckQueueControl(&control);
  }
  std::_Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>::
  ~_Vector_base(&vChecks.
                 super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>
               );
  std::
  unique_ptr<CCheckQueue<FakeCheckCheckCompletion>,_std::default_delete<CCheckQueue<FakeCheckCheckCompletion>_>_>
  ::~unique_ptr(&small_queue);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CheckQueueTest::Correct_Queue_range(std::vector<size_t> range)
{
    auto small_queue = std::make_unique<Correct_Queue>(QUEUE_BATCH_SIZE, SCRIPT_CHECK_THREADS);
    // Make vChecks here to save on malloc (this test can be slow...)
    std::vector<FakeCheckCheckCompletion> vChecks;
    vChecks.reserve(9);
    for (const size_t i : range) {
        size_t total = i;
        FakeCheckCheckCompletion::n_calls = 0;
        CCheckQueueControl<FakeCheckCheckCompletion> control(small_queue.get());
        while (total) {
            vChecks.clear();
            vChecks.resize(std::min<size_t>(total, m_rng.randrange(10)));
            total -= vChecks.size();
            control.Add(std::move(vChecks));
        }
        BOOST_REQUIRE(control.Wait());
        BOOST_REQUIRE_EQUAL(FakeCheckCheckCompletion::n_calls, i);
    }
}